

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O0

bool __thiscall
Fossilize::DatabaseInterface::load_whitelist_database(DatabaseInterface *this,char *path)

{
  Impl *this_00;
  bool bVar1;
  LogLevel LVar2;
  uint uVar3;
  DatabaseInterface *__p;
  pointer pDVar4;
  char *path_local;
  DatabaseInterface *this_local;
  
  if (this->impl->mode == ReadOnly) {
    bVar1 = std::
            vector<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
            ::empty(&this->impl->imported_metadata);
    if (bVar1) {
      this_00 = this->impl;
      __p = create_stream_archive_database(path,ReadOnly);
      std::
      unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>::
      reset(&this_00->whitelist,__p);
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)this->impl);
      if (bVar1) {
        pDVar4 = std::
                 unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                 ::operator->(&this->impl->whitelist);
        uVar3 = (*pDVar4->_vptr_DatabaseInterface[2])();
        if ((uVar3 & 1) == 0) {
          std::
          unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
          ::reset(&this->impl->whitelist,(pointer)0x0);
          this_local._7_1_ = false;
        }
        else {
          this_local._7_1_ = true;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      LVar2 = get_thread_log_level();
      if (((int)LVar2 < 3) &&
         (bVar1 = Internal::log_thread_callback
                            (LOG_ERROR,"Cannot use imported metadata together with whitelists.\n"),
         !bVar1)) {
        fprintf(_stderr,"Fossilize ERROR: Cannot use imported metadata together with whitelists.\n")
        ;
      }
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool DatabaseInterface::load_whitelist_database(const char *path)
{
	if (impl->mode != DatabaseMode::ReadOnly)
		return false;

	if (!impl->imported_metadata.empty())
	{
		LOGE_LEVEL("Cannot use imported metadata together with whitelists.\n");
		return false;
	}

	impl->whitelist.reset(create_stream_archive_database(path, DatabaseMode::ReadOnly));

	if (!impl->whitelist)
		return false;

	if (!impl->whitelist->prepare())
	{
		impl->whitelist.reset();
		return false;
	}

	return true;
}